

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter> *
__thiscall
kj::_::NullableValue<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>::
operator=(NullableValue<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
          *this,NullableValue<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                *other)

{
  ConnectionCounter *params;
  NullableValue<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  *other_local;
  NullableValue<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                (&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                         (&(other->field_1).value);
      ctor<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                (&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }